

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_get_urlarg_by_name_safe(lws *wsi,char *name,char *buf,int len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_38;
  int sl;
  int fraglen;
  int n;
  int len_local;
  char *buf_local;
  char *name_local;
  lws *wsi_local;
  
  sl = 0;
  sVar3 = strlen(name);
  local_38 = (int)sVar3;
  while( true ) {
    iVar1 = lws_hdr_copy_fragment(wsi,buf,len,WSI_TOKEN_HTTP_URI_ARGS,sl);
    if (iVar1 < 0) {
      return -1;
    }
    if (((iVar1 + 1 < len) && (local_38 <= iVar1)) &&
       (iVar2 = strncmp(buf,name,(long)local_38), iVar2 == 0)) break;
    sl = sl + 1;
  }
  if (((name[local_38 + -1] != '=') && (local_38 < iVar1)) && (buf[local_38] == '=')) {
    local_38 = local_38 + 1;
  }
  memmove(buf,buf + local_38,(long)(iVar1 - local_38));
  buf[iVar1 - local_38] = '\0';
  return iVar1 - local_38;
}

Assistant:

int
lws_get_urlarg_by_name_safe(struct lws *wsi, const char *name, char *buf, int len)
{
	int n = 0, fraglen, sl = (int)strlen(name);

	do {
		fraglen = lws_hdr_copy_fragment(wsi, buf, len,
						WSI_TOKEN_HTTP_URI_ARGS, n);

		if (fraglen < 0)
			break;

		if (fraglen + 1 < len &&
		    fraglen >= sl &&
		    !strncmp(buf, name, (size_t)sl)) {
			/*
			 * If he left off the trailing =, trim it from the
			 * result
			 */

			if (name[sl - 1] != '=' &&
			    sl < fraglen &&
			    buf[sl] == '=')
				sl++;

			memmove(buf, buf + sl, (size_t)(fraglen - sl));
			buf[fraglen - sl] = '\0';

			return fraglen - sl;
		}

		n++;
	} while (1);

	return -1;
}